

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::q_points_into_range<QArrayDataPointer<QModelIndex>,QModelIndex_const*>
               (QModelIndex **p,QArrayDataPointer<QModelIndex> *c)

{
  undefined8 uVar1;
  bool bVar2;
  QModelIndex *__last;
  QModelIndex *__first;
  difference_type dVar3;
  undefined8 *in_RDI;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<QModelIndex>>((QArrayDataPointer<QModelIndex> *)0x8bc6c5);
  __first = std::data<QArrayDataPointer<QModelIndex>>((QArrayDataPointer<QModelIndex> *)0x8bc6d4);
  std::begin<QArrayDataPointer<QModelIndex>>((QArrayDataPointer<QModelIndex> *)0x8bc6e3);
  std::end<QArrayDataPointer<QModelIndex>>((QArrayDataPointer<QModelIndex> *)0x8bc6f4);
  dVar3 = std::distance<QModelIndex_const*>(__first,__last);
  bVar2 = q_points_into_range<QModelIndex,std::less<void>>(uVar1,__last,__first + dVar3);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}